

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SetBuilder.h
# Opt level: O0

void __thiscall Refal2::CSetBuilder<char>::Include(CSetBuilder<char> *this,char *element)

{
  undefined1 local_48 [8];
  CSet tmp;
  char *element_local;
  CSetBuilder<char> *this_local;
  
  tmp._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)element;
  std::set<char,_std::less<char>,_std::allocator<char>_>::set
            ((set<char,_std::less<char>,_std::allocator<char>_> *)local_48);
  std::set<char,_std::less<char>,_std::allocator<char>_>::insert
            ((set<char,_std::less<char>,_std::allocator<char>_> *)local_48,
             (value_type_conflict1 *)tmp._M_t._M_impl.super__Rb_tree_header._M_node_count);
  Include(this,(CSet *)local_48);
  std::set<char,_std::less<char>,_std::allocator<char>_>::~set
            ((set<char,_std::less<char>,_std::allocator<char>_> *)local_48);
  return;
}

Assistant:

void CSetBuilder<T>::Include( const T& element )
{
	CSet tmp;
	tmp.insert( element );
	Include( tmp );
}